

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy>::
create_process_line(jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy>
                    *this,byte_span info,size_t stride)

{
  coding_parameters *__args_4;
  color_transformation cVar1;
  jpegls_errc error_value;
  undefined1 auVar2 [8];
  bool bVar3;
  jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this_00;
  frame_info *__args_3;
  size_t stride_local;
  int local_38 [2];
  undefined1 local_30 [8];
  byte_span info_local;
  
  info_local.data = (uint8_t *)info.size;
  this_00 = (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *)
            info.data;
  info_local.size = stride;
  bVar3 = is_interleaved(this_00);
  if (bVar3) {
    __args_4 = &(this_00->super_decoder_strategy).parameters_;
    cVar1 = (this_00->super_decoder_strategy).parameters_.transformation;
    if (cVar1 == None) {
      std::
      make_unique<charls::process_transformed<charls::transform_none<unsigned_short>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_none<unsigned_short>>
                ((byte_span *)local_30,(unsigned_long *)&info_local,
                 (charls_frame_info *)&stride_local,
                 (coding_parameters *)&(this_00->super_decoder_strategy).frame_info_,
                 (transform_none<unsigned_short> *)__args_4);
      auVar2 = local_30;
      local_30 = (undefined1  [8])0x0;
      (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)auVar2;
      std::
      unique_ptr<charls::process_transformed<charls::transform_none<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_none<unsigned_short>_>_>_>
      ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_none<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_none<unsigned_short>_>_>_>
                     *)local_30);
    }
    else {
      if ((this_00->super_decoder_strategy).frame_info_.bits_per_sample != 0x10) {
        error_value = bit_depth_for_transform_not_supported;
LAB_0011078a:
        impl::throw_jpegls_error(error_value);
      }
      __args_3 = &(this_00->super_decoder_strategy).frame_info_;
      if (cVar1 == HP3) {
        std::
        make_unique<charls::process_transformed<charls::transform_hp3<unsigned_short>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_hp3<unsigned_short>>
                  ((byte_span *)local_30,(unsigned_long *)&info_local,
                   (charls_frame_info *)&stride_local,(coding_parameters *)__args_3,
                   (transform_hp3<unsigned_short> *)__args_4);
        auVar2 = local_30;
        local_30 = (undefined1  [8])0x0;
        (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)auVar2;
        std::
        unique_ptr<charls::process_transformed<charls::transform_hp3<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_hp3<unsigned_short>_>_>_>
        ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_hp3<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_hp3<unsigned_short>_>_>_>
                       *)local_30);
      }
      else if (cVar1 == HP2) {
        std::
        make_unique<charls::process_transformed<charls::transform_hp2<unsigned_short>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_hp2<unsigned_short>>
                  ((byte_span *)local_30,(unsigned_long *)&info_local,
                   (charls_frame_info *)&stride_local,(coding_parameters *)__args_3,
                   (transform_hp2<unsigned_short> *)__args_4);
        auVar2 = local_30;
        local_30 = (undefined1  [8])0x0;
        (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)auVar2;
        std::
        unique_ptr<charls::process_transformed<charls::transform_hp2<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_hp2<unsigned_short>_>_>_>
        ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_hp2<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_hp2<unsigned_short>_>_>_>
                       *)local_30);
      }
      else {
        if (cVar1 != HP1) {
          error_value = UnsupportedColorTransform;
          goto LAB_0011078a;
        }
        std::
        make_unique<charls::process_transformed<charls::transform_hp1<unsigned_short>>,charls::byte_span&,unsigned_long_const&,charls_frame_info_const&,charls::coding_parameters_const&,charls::transform_hp1<unsigned_short>>
                  ((byte_span *)local_30,(unsigned_long *)&info_local,
                   (charls_frame_info *)&stride_local,(coding_parameters *)__args_3,
                   (transform_hp1<unsigned_short> *)__args_4);
        auVar2 = local_30;
        local_30 = (undefined1  [8])0x0;
        (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)auVar2;
        std::
        unique_ptr<charls::process_transformed<charls::transform_hp1<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_hp1<unsigned_short>_>_>_>
        ::~unique_ptr((unique_ptr<charls::process_transformed<charls::transform_hp1<unsigned_short>_>,_std::default_delete<charls::process_transformed<charls::transform_hp1<unsigned_short>_>_>_>
                       *)local_30);
      }
    }
  }
  else if ((this_00->super_decoder_strategy).frame_info_.bits_per_sample == 0x10) {
    local_38[0] = 2;
    local_38[1] = 0;
    std::
    make_unique<charls::post_process_single_component,unsigned_char*&,unsigned_long_const&,unsigned_long>
              ((uchar **)local_30,(unsigned_long *)&info_local,&stride_local);
    auVar2 = local_30;
    local_30 = (undefined1  [8])0x0;
    (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)auVar2;
    std::
    unique_ptr<charls::post_process_single_component,_std::default_delete<charls::post_process_single_component>_>
    ::~unique_ptr((unique_ptr<charls::post_process_single_component,_std::default_delete<charls::post_process_single_component>_>
                   *)local_30);
  }
  else {
    local_38[0] = 2;
    local_38[1] = 0;
    std::
    make_unique<charls::post_process_single_component_masked,unsigned_char*&,unsigned_long_const&,unsigned_long,int_const&>
              ((uchar **)local_30,(unsigned_long *)&info_local,&stride_local,local_38);
    auVar2 = local_30;
    local_30 = (undefined1  [8])0x0;
    (this->super_decoder_strategy)._vptr_decoder_strategy = (_func_int **)auVar2;
    std::
    unique_ptr<charls::post_process_single_component_masked,_std::default_delete<charls::post_process_single_component_masked>_>
    ::~unique_ptr((unique_ptr<charls::post_process_single_component_masked,_std::default_delete<charls::post_process_single_component_masked>_>
                   *)local_30);
  }
  return (__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
          )(__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<process_line> create_process_line(byte_span info, const size_t stride) override
    {
        if (!is_interleaved())
        {
            if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
            {
                return std::make_unique<post_process_single_component>(info.data, stride,
                                                                       sizeof(typename Traits::pixel_type));
            }

            return std::make_unique<post_process_single_component_masked>(
                info.data, stride, sizeof(typename Traits::pixel_type), frame_info().bits_per_sample);
        }

        if (parameters().transformation == color_transformation::none)
            return std::make_unique<process_transformed<transform_none<typename Traits::sample_type>>>(
                info, stride, frame_info(), parameters(), transform_none<sample_type>());

        if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
        {
            switch (parameters().transformation)
            {
            case color_transformation::hp1:
                return std::make_unique<process_transformed<transform_hp1<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp1<sample_type>());
            case color_transformation::hp2:
                return std::make_unique<process_transformed<transform_hp2<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp2<sample_type>());
            case color_transformation::hp3:
                return std::make_unique<process_transformed<transform_hp3<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp3<sample_type>());
            default:
                impl::throw_jpegls_error(jpegls_errc::color_transform_not_supported);
            }
        }

        impl::throw_jpegls_error(jpegls_errc::bit_depth_for_transform_not_supported);
    }